

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocks.c
# Opt level: O3

void psocks_cmdline(psocks_state *ps,int argc,char **argv)

{
  char **ppcVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  Conf *conf;
  char *pcVar8;
  psocks_state *ppVar9;
  psocks_state *s;
  
  if (1 < argc) {
    bVar5 = true;
    bVar4 = false;
    bVar3 = false;
    ppVar9 = ps;
    do {
      iVar7 = argc + -1;
      ppcVar1 = argv + 1;
      s = (psocks_state *)argv[1];
      if ((bVar5) && (*(char *)&s->platform == '-')) {
        bVar2 = *(byte *)((long)&s->platform + 1);
        if (0x65 < bVar2) {
          if (bVar2 == 0x66) {
            if (*(char *)((long)&s->platform + 2) != '\0') goto LAB_001045ab;
            ps->rec_dest = REC_FILE;
LAB_001045e6:
            bVar5 = true;
            s = ppVar9;
            argv = ppcVar1;
            argc = iVar7;
            goto LAB_001045ec;
          }
          if (bVar2 == 0x67) {
            if (*(char *)((long)&s->platform + 2) == '\0') {
              ps->acceptall = true;
              goto LAB_001045e6;
            }
            goto LAB_001045ab;
          }
          if ((bVar2 != 0x70) || (*(char *)((long)&s->platform + 2) != '\0')) goto LAB_001045ab;
          if (ps->platform->open_pipes ==
              (_func_PsocksDataSink_ptr_char_ptr_char_ptr_ptr_char_ptr_char_ptr_ptr *)0x0)
          goto LAB_001046f5;
          if (argc != 2) {
            argc = argc + -2;
            s = (psocks_state *)argv[2];
            argv = argv + 2;
            pcVar8 = dupstr((char *)s);
            ps->rec_cmd = pcVar8;
            ps->rec_dest = REC_PIPE;
            bVar5 = true;
            goto LAB_001045ec;
          }
LAB_001046f0:
          psocks_cmdline_cold_1();
LAB_001046f5:
          psocks_cmdline_cold_2();
          conf = conf_new();
          conf_set_bool(conf,0xae,ppVar9->acceptall);
          pcVar8 = dupprintf("AL%d",(ulong)(uint)ppVar9->listen_port);
          conf_set_str_str(conf,0xb0,pcVar8,"D");
          safefree(pcVar8);
          portfwdmgr_config(ppVar9->portfwdmgr,conf);
          if (ppVar9->subcmd->len != 0) {
            (*ppVar9->platform->start_subcommand)(ppVar9->subcmd);
          }
          conf_free(conf);
          return;
        }
        if (bVar2 == 0) goto LAB_001044d7;
        if (bVar2 == 0x2d) {
          if (*(char *)((long)&s->platform + 2) != '\0') goto LAB_001045ab;
        }
        else {
          if ((bVar2 == 100) && (*(char *)((long)&s->platform + 2) == '\0')) {
            *(byte *)&ps->log_flags = (byte)ps->log_flags | 2;
            goto LAB_001045e6;
          }
LAB_001045ab:
          ppVar9 = s;
          iVar6 = strcmp((char *)s,"--exec");
          if (iVar6 != 0) goto LAB_00104612;
          if (ps->platform->start_subcommand == (_func_void_strbuf_ptr *)0x0) {
            psocks_cmdline_cold_5();
            goto LAB_001046e8;
          }
          bVar3 = true;
        }
        bVar5 = false;
        s = ppVar9;
        argv = ppcVar1;
        argc = iVar7;
      }
      else {
LAB_001044d7:
        if (bVar3) {
          ppVar9 = (psocks_state *)ps->subcmd->binarysink_;
          BinarySink_put_asciz((BinarySink *)ppVar9,(char *)s);
          bVar3 = true;
          s = ppVar9;
          argv = ppcVar1;
          argc = iVar7;
        }
        else {
          if (bVar4) {
            psocks_cmdline_cold_3();
LAB_00104612:
            iVar7 = strcmp((char *)s,"--help");
            if (iVar7 == 0) {
              printf("usage: psocks [ -d ] [ -f");
              if (ps->platform->open_pipes !=
                  (_func_PsocksDataSink_ptr_char_ptr_char_ptr_ptr_char_ptr_char_ptr_ptr *)0x0) {
                printf(" | -p pipe-cmd");
              }
              printf(" ] [ -g ] port-number");
              putchar(10);
              puts("where: -d           log all connection contents to standard output");
              puts("       -f           record each half-connection to a file sockin.N/sockout.N");
              if (ps->platform->open_pipes !=
                  (_func_PsocksDataSink_ptr_char_ptr_char_ptr_ptr_char_ptr_char_ptr_ptr *)0x0) {
                puts("       -p pipe-cmd  pipe each half-connection to \'pipe-cmd [in|out] N\'");
              }
              puts("       -g           accept connections from anywhere, not just localhost");
              if (ps->platform->start_subcommand != (_func_void_strbuf_ptr *)0x0) {
                puts("       --exec subcmd [args...]   run command, and terminate when it exits");
              }
              puts("       port-number  listen on this port (default 1080)");
              puts("also: psocks --help      display this help text");
              exit(0);
            }
LAB_001046e8:
            psocks_cmdline_cold_4();
            ppVar9 = s;
            goto LAB_001046f0;
          }
          iVar6 = atoi((char *)s);
          ps->listen_port = iVar6;
          bVar4 = true;
          bVar3 = false;
          argv = ppcVar1;
          argc = iVar7;
        }
      }
LAB_001045ec:
      ppVar9 = s;
    } while (1 < argc);
  }
  return;
}

Assistant:

void psocks_cmdline(psocks_state *ps, int argc, char **argv)
{
    bool doing_opts = true;
    bool accumulating_exec_args = false;
    size_t args_seen = 0;

    while (--argc > 0) {
	const char *p = *++argv;

	if (doing_opts && p[0] == '-' && p[1]) {
            if (!strcmp(p, "--")) {
                doing_opts = false;
            } else if (!strcmp(p, "-g")) {
		ps->acceptall = true;
            } else if (!strcmp(p, "-d")) {
		ps->log_flags |= LOG_DIALOGUE;
            } else if (!strcmp(p, "-f")) {
		ps->rec_dest = REC_FILE;
            } else if (!strcmp(p, "-p")) {
                if (!ps->platform->open_pipes) {
		    fprintf(stderr, "psocks: '-p' is not supported on this "
                            "platform\n");
		    exit(1);
                }
		if (--argc > 0) {
		    ps->rec_cmd = dupstr(*++argv);
		} else {
		    fprintf(stderr, "psocks: expected an argument to '-p'\n");
		    exit(1);
		}
		ps->rec_dest = REC_PIPE;
	    } else if (!strcmp(p, "--exec")) {
                if (!ps->platform->start_subcommand) {
		    fprintf(stderr, "psocks: running a subcommand is not "
                            "supported on this platform\n");
		    exit(1);
                }
                accumulating_exec_args = true;
                /* Now consume all further argv words for the
                 * subcommand, even if they look like options */
                doing_opts = false;
	    } else if (!strcmp(p, "--help")) {
                printf("usage: psocks [ -d ] [ -f");
                if (ps->platform->open_pipes)
                    printf(" | -p pipe-cmd");
                printf(" ] [ -g ] port-number");
                printf("\n");
                printf("where: -d           log all connection contents to"
                       " standard output\n");
                printf("       -f           record each half-connection to "
                       "a file sockin.N/sockout.N\n");
                if (ps->platform->open_pipes)
                    printf("       -p pipe-cmd  pipe each half-connection"
                           " to 'pipe-cmd [in|out] N'\n");
                printf("       -g           accept connections from anywhere,"
                       " not just localhost\n");
                if (ps->platform->start_subcommand)
                    printf("       --exec subcmd [args...]   run command, and "
                           "terminate when it exits\n");
                printf("       port-number  listen on this port"
                       " (default 1080)\n");
                printf("also: psocks --help      display this help text\n");
                exit(0);
            } else {
                fprintf(stderr, "psocks: unrecognised option '%s'\n", p);
                exit(1);
            }
	} else {
            if (accumulating_exec_args) {
                put_asciz(ps->subcmd, p);
            } else switch (args_seen++) {
              case 0:
                ps->listen_port = atoi(p);
                break;
              default:
                fprintf(stderr, "psocks: unexpected extra argument '%s'\n", p);
                exit(1);
                break;
            }
	}
    }
}